

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall
c4::yml::Tree::duplicate(Tree *this,Tree *src,size_t node,size_t parent,size_t after)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  bool bVar7;
  size_t sVar8;
  csubstr cVar9;
  char msg [31];
  char *pcStack_b8;
  size_t local_b0;
  char *pcStack_90;
  size_t local_88;
  char *pcStack_68;
  size_t local_60;
  char *pcStack_40;
  size_t local_38;
  
  if (src == (Tree *)0x0) {
    builtin_strncpy(msg,"check failed: (src != nullptr)",0x1f);
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar2 = (code *)swi(3);
        sVar8 = (*pcVar2)();
        return sVar8;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar9 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_38 = cVar9.len;
    pcStack_40 = cVar9.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x65a3) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x65a3) << 0x40,8);
    LVar3.name.str = pcStack_40;
    LVar3.name.len = local_38;
    (*p_Var1)(msg,0x1f,LVar3,(this->m_callbacks).m_user_data);
  }
  if (node == 0xffffffffffffffff) {
    builtin_strncpy(msg,"check failed: (node != NONE)",0x1d);
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar2 = (code *)swi(3);
        sVar8 = (*pcVar2)();
        return sVar8;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar9 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_60 = cVar9.len;
    pcStack_68 = cVar9.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x65a4) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x65a4) << 0x40,8);
    LVar4.name.str = pcStack_68;
    LVar4.name.len = local_60;
    (*p_Var1)(msg,0x1d,LVar4,(this->m_callbacks).m_user_data);
  }
  if (parent == 0xffffffffffffffff) {
    builtin_strncpy(msg,"check failed: (parent != NONE)",0x1f);
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar2 = (code *)swi(3);
        sVar8 = (*pcVar2)();
        return sVar8;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar9 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_88 = cVar9.len;
    pcStack_90 = cVar9.str;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x65a5) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x65a5) << 0x40,8);
    LVar5.name.str = pcStack_90;
    LVar5.name.len = local_88;
    (*p_Var1)(msg,0x1f,LVar5,(this->m_callbacks).m_user_data);
  }
  bVar7 = is_root(src,node);
  if (bVar7) {
    builtin_strncpy(msg,"check failed: (! src->is_root(n",0x1f);
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar2 = (code *)swi(3);
        sVar8 = (*pcVar2)();
        return sVar8;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar9 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_b0 = cVar9.len;
    pcStack_b8 = cVar9.str;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x65a6) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x65a6) << 0x40,8);
    LVar6.name.str = pcStack_b8;
    LVar6.name.len = local_b0;
    (*p_Var1)(msg,0x25,LVar6,(this->m_callbacks).m_user_data);
  }
  sVar8 = _claim(this);
  _copy_props(this,sVar8,src,node);
  _set_hierarchy(this,sVar8,parent,after);
  duplicate_children(this,src,node,sVar8,0xffffffffffffffff);
  return sVar8;
}

Assistant:

size_t Tree::duplicate(Tree const* src, size_t node, size_t parent, size_t after)
{
    _RYML_CB_ASSERT(m_callbacks, src != nullptr);
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, parent != NONE);
    _RYML_CB_ASSERT(m_callbacks,  ! src->is_root(node));

    size_t copy = _claim();

    _copy_props(copy, src, node);
    _set_hierarchy(copy, parent, after);
    duplicate_children(src, node, copy, NONE);

    return copy;
}